

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clasp_facade.cpp
# Opt level: O0

void __thiscall Clasp::ClaspFacade::SolveData::BoundArray::~BoundArray(BoundArray *this)

{
  bool bVar1;
  reference ppLVar2;
  long in_RDI;
  
  while( true ) {
    bVar1 = bk_lib::
            pod_vector<Clasp::ClaspFacade::SolveData::BoundArray::LevelRef_*,_std::allocator<Clasp::ClaspFacade::SolveData::BoundArray::LevelRef_*>_>
            ::empty((pod_vector<Clasp::ClaspFacade::SolveData::BoundArray::LevelRef_*,_std::allocator<Clasp::ClaspFacade::SolveData::BoundArray::LevelRef_*>_>
                     *)(in_RDI + 8));
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    ppLVar2 = bk_lib::
              pod_vector<Clasp::ClaspFacade::SolveData::BoundArray::LevelRef_*,_std::allocator<Clasp::ClaspFacade::SolveData::BoundArray::LevelRef_*>_>
              ::back((pod_vector<Clasp::ClaspFacade::SolveData::BoundArray::LevelRef_*,_std::allocator<Clasp::ClaspFacade::SolveData::BoundArray::LevelRef_*>_>
                      *)(in_RDI + 8));
    if (*ppLVar2 != (LevelRef *)0x0) {
      operator_delete(*ppLVar2);
    }
    bk_lib::
    pod_vector<Clasp::ClaspFacade::SolveData::BoundArray::LevelRef_*,_std::allocator<Clasp::ClaspFacade::SolveData::BoundArray::LevelRef_*>_>
    ::pop_back((pod_vector<Clasp::ClaspFacade::SolveData::BoundArray::LevelRef_*,_std::allocator<Clasp::ClaspFacade::SolveData::BoundArray::LevelRef_*>_>
                *)(in_RDI + 8));
  }
  bk_lib::
  pod_vector<Clasp::ClaspFacade::SolveData::BoundArray::LevelRef_*,_std::allocator<Clasp::ClaspFacade::SolveData::BoundArray::LevelRef_*>_>
  ::~pod_vector((pod_vector<Clasp::ClaspFacade::SolveData::BoundArray::LevelRef_*,_std::allocator<Clasp::ClaspFacade::SolveData::BoundArray::LevelRef_*>_>
                 *)0x12deb3);
  return;
}

Assistant:

~BoundArray() { while (!refs.empty()) { delete refs.back(); refs.pop_back(); } }